

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::onAvailableImage
          (ClientConductor *this,int32_t streamId,int32_t sessionId,string *logFilename,
          string *sourceIdentity,int32_t subscriberPositionIndicatorId,
          int64_t subscriberPositionRegistrationId,int64_t correlationId)

{
  pointer pSVar1;
  int64_t subscriptionRegistrationId;
  bool bVar2;
  ImageList *imageList;
  longlong now;
  pointer pSVar3;
  shared_ptr<aeron::Subscription> subscription;
  __shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2> local_198;
  shared_ptr<aeron::LogBuffers> logBuffers;
  UnsafeBufferPosition subscriberPosition;
  Image image;
  
  std::recursive_mutex::lock(&this->m_adminLock);
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->m_subscriptions).
                super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    if (pSVar3->m_streamId == streamId) {
      std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>,
                 &pSVar3->m_subscription);
      if (subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        bVar2 = Subscription::hasImage
                          (subscription.
                           super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,correlationId);
        if ((!bVar2) &&
           ((subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->m_registrationId == subscriberPositionRegistrationId)) {
          image._vptr_Image = (_func_int **)(logFilename->_M_dataplus)._M_p;
          std::make_shared<aeron::LogBuffers,char_const*>
                    ((char **)&logBuffers.
                               super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>);
          subscriberPosition.m_buffer._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0016e198
          ;
          subscriberPosition.m_buffer.m_length = this->m_counterValuesBuffer->m_length;
          subscriberPosition.m_buffer.m_buffer = this->m_counterValuesBuffer->m_buffer;
          subscriptionRegistrationId =
               (subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_registrationId;
          subscriberPosition.m_id = subscriberPositionIndicatorId;
          subscriberPosition.m_offset = subscriberPositionIndicatorId << 7;
          std::__shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_198,
                     &logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>);
          Image::Image(&image,sessionId,correlationId,subscriptionRegistrationId,sourceIdentity,
                       &subscriberPosition,(shared_ptr<aeron::LogBuffers> *)&local_198,
                       &this->m_errorHandler);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
          std::function<void_(aeron::Image_&)>::operator()
                    (&pSVar3->m_onAvailableImageHandler,&image);
          imageList = Subscription::addImage
                                (subscription.
                                 super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&image);
          if (imageList != (ImageList *)0x0) {
            now = std::function<long_long_()>::operator()(&this->m_epochClock);
            lingerResource(this,now,imageList);
          }
          Image::~Image(&image);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onAvailableImage(
    std::int32_t streamId,
    std::int32_t sessionId,
    const std::string &logFilename,
    const std::string &sourceIdentity,
    std::int32_t subscriberPositionIndicatorId,
    std::int64_t subscriberPositionRegistrationId,
    std::int64_t correlationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&](const SubscriptionStateDefn &entry)
        {
            if (streamId == entry.m_streamId)
            {
                std::shared_ptr<Subscription> subscription = entry.m_subscription.lock();

                if (subscription != nullptr &&
                    !(subscription->hasImage(correlationId)) &&
                    subscriberPositionRegistrationId == subscription->registrationId())
                {
                    std::shared_ptr<LogBuffers> logBuffers = std::make_shared<LogBuffers>(logFilename.c_str());

                    UnsafeBufferPosition subscriberPosition(m_counterValuesBuffer, subscriberPositionIndicatorId);

                    Image image(
                        sessionId,
                        correlationId,
                        subscription->registrationId(),
                        sourceIdentity,
                        subscriberPosition,
                        logBuffers,
                        m_errorHandler);

                    entry.m_onAvailableImageHandler(image);

                    struct ImageList *oldImageList = subscription->addImage(image);

                    if (nullptr != oldImageList)
                    {
                        lingerResource(m_epochClock(), oldImageList);
                    }
                }
            }
        });
}